

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

String * __thiscall Json::OurReader::getFormattedErrorMessages_abi_cxx11_(OurReader *this)

{
  bool bVar1;
  long in_RSI;
  _Self *in_RDI;
  ErrorInfo *error;
  const_iterator __end1;
  const_iterator __begin1;
  Errors *__range1;
  String *formattedMessage;
  _Self *in_stack_fffffffffffffe68;
  _Self *__lhs;
  string local_178 [32];
  string local_158 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  string local_138 [24];
  Location in_stack_fffffffffffffee0;
  OurReader *in_stack_fffffffffffffee8;
  string local_f8 [48];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  reference local_68;
  _Deque_iterator<Json::OurReader::ErrorInfo,_const_Json::OurReader::ErrorInfo_&,_const_Json::OurReader::ErrorInfo_*>
  local_40;
  long local_20;
  undefined1 local_11;
  
  local_11 = 0;
  __lhs = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  local_20 = in_RSI + 0x50;
  std::deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>::begin
            ((deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_> *)
             in_stack_fffffffffffffe68);
  std::deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>::end
            ((deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_> *)
             in_stack_fffffffffffffe68);
  while (bVar1 = std::operator!=(in_RDI,in_stack_fffffffffffffe68), bVar1) {
    local_68 = std::
               _Deque_iterator<Json::OurReader::ErrorInfo,_const_Json::OurReader::ErrorInfo_&,_const_Json::OurReader::ErrorInfo_*>
               ::operator*(&local_40);
    getLocationLineAndColumn_abi_cxx11_(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std::operator+((char *)__lhs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                   (char *)in_RDI);
    std::__cxx11::string::operator+=((string *)in_RDI,local_88);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_c8);
    std::operator+(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                   (char *)in_RDI);
    std::__cxx11::string::operator+=((string *)in_RDI,local_f8);
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffee8);
    if (local_68->extra_ != (Location)0x0) {
      getLocationLineAndColumn_abi_cxx11_(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
      std::operator+((char *)__lhs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     (char *)in_RDI);
      std::__cxx11::string::operator+=((string *)in_RDI,local_138);
      std::__cxx11::string::~string(local_138);
      std::__cxx11::string::~string(local_158);
      std::__cxx11::string::~string(local_178);
    }
    std::
    _Deque_iterator<Json::OurReader::ErrorInfo,_const_Json::OurReader::ErrorInfo_&,_const_Json::OurReader::ErrorInfo_*>
    ::operator++(in_RDI);
  }
  return (String *)__lhs;
}

Assistant:

String OurReader::getFormattedErrorMessages() const {
  String formattedMessage;
  for (const auto& error : errors_) {
    formattedMessage +=
        "* " + getLocationLineAndColumn(error.token_.start_) + "\n";
    formattedMessage += "  " + error.message_ + "\n";
    if (error.extra_)
      formattedMessage +=
          "See " + getLocationLineAndColumn(error.extra_) + " for detail.\n";
  }
  return formattedMessage;
}